

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Walker *pWVar1;
  uint uVar2;
  int iVar3;
  Walker *in_RSI;
  Select *in_RDI;
  int rc;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI != (Walker *)0x0) {
    pWVar1 = *(Walker **)&in_RDI->selId;
    while (pWVar1 != (Walker *)0x0) {
      uVar2 = (**(code **)&in_RDI->selId)(in_RDI,in_RSI);
      if (uVar2 != 0) {
        return uVar2 & 2;
      }
      iVar3 = sqlite3WalkSelectExpr(in_RSI,(Select *)(ulong)in_stack_ffffffffffffffe0);
      if ((iVar3 != 0) ||
         (iVar3 = sqlite3WalkSelectFrom
                            ((Walker *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                             ,in_RDI), iVar3 != 0)) {
        return 2;
      }
      if (*(long *)(in_RDI->addrOpenEphm + 1) != 0) {
        (**(code **)(in_RDI->addrOpenEphm + 1))(in_RDI,in_RSI);
      }
      in_RSI = *(Walker **)&in_RSI[1].walkerDepth;
      pWVar1 = in_RSI;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}